

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::DoCompactionWork(DBImpl *this,CompactionState *compact)

{
  _func_int **pp_Var1;
  CleanupFunction p_Var2;
  void *pvVar3;
  Logger *info_log;
  bool bVar4;
  int iVar5;
  long lVar6;
  pointer pOVar7;
  Iterator *pIVar8;
  long lVar9;
  long lVar10;
  undefined4 extraout_var;
  uint64_t uVar11;
  undefined4 extraout_var_00;
  _func_int *p_Var12;
  char *pcVar13;
  long *plVar14;
  Iterator *in_RDX;
  undefined8 extraout_RDX;
  Env *extraout_RDX_00;
  TableBuilder *pTVar15;
  ulong uVar16;
  ulong uVar17;
  CleanupFunction p_Var18;
  bool bVar19;
  undefined1 local_118 [48];
  ParsedInternalKey ikey;
  LevelSummaryStorage tmp;
  string current_user_key;
  
  lVar6 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
  pp_Var1 = in_RDX->_vptr_Iterator;
  Log((Logger *)compact[1].smallest_snapshot,"Compacting %d@%d + %d@%d files",
      (ulong)((long)pp_Var1[0x19] - (long)pp_Var1[0x18]) >> 3,(ulong)*(uint *)pp_Var1,
      (ulong)((long)pp_Var1[0x1c] - (long)pp_Var1[0x1b]) >> 3);
  iVar5 = VersionSet::NumLevelFiles
                    ((VersionSet *)
                     compact[8].outputs.
                     super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     *(int *)in_RDX->_vptr_Iterator);
  if (iVar5 < 1) {
    __assert_fail("versions_->NumLevelFiles(compact->compaction->level()) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x37e,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX[1].cleanup_.function != (CleanupFunction)0x0) {
    __assert_fail("compact->builder==NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x37f,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX[1]._vptr_Iterator != (_func_int **)0x0) {
    __assert_fail("compact->outfile==NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x380,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (compact[7].outputs.
      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)&compact[6].total_bytes) {
    pOVar7 = compact[8].outputs.
             super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  }
  else {
    pOVar7 = (pointer)SnapshotList::oldest((SnapshotList *)&compact[6].total_bytes);
  }
  p_Var18 = (CleanupFunction)0xffffffffffffff;
  (in_RDX->cleanup_).function = (CleanupFunction)pOVar7->file_size;
  local_118._32_8_ = compact + 3;
  port::Mutex::Unlock((Mutex *)local_118._32_8_);
  pIVar8 = VersionSet::MakeInputIterator
                     ((VersionSet *)
                      compact[8].outputs.
                      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (Compaction *)in_RDX->_vptr_Iterator);
  (*pIVar8->_vptr_Iterator[3])(pIVar8);
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  ikey.user_key.data_ = "";
  ikey.user_key.size_ = 0;
  current_user_key._M_dataplus._M_p = (pointer)&current_user_key.field_2;
  current_user_key._M_string_length = 0;
  current_user_key.field_2._M_local_buf[0] = '\0';
  bVar19 = false;
  local_118._24_8_ = (Comparator *)0x0;
  while ((iVar5 = (*pIVar8->_vptr_Iterator[2])(pIVar8), (char)iVar5 != '\0' &&
         (compact[3].outfile == (WritableFile *)0x0))) {
    if (compact[4].total_bytes != 0) {
      lVar9 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
      port::Mutex::Lock((Mutex *)local_118._32_8_);
      if (compact[4].builder != (TableBuilder *)0x0) {
        CompactMemTable((DBImpl *)compact);
        port::CondVar::SignalAll((CondVar *)&compact[3].builder);
      }
      port::Mutex::Unlock((Mutex *)local_118._32_8_);
      lVar10 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
      local_118._24_8_ = local_118._24_8_ + (lVar10 - lVar9);
    }
    tmp.buffer._0_4_ = (*pIVar8->_vptr_Iterator[8])(pIVar8);
    tmp.buffer._4_4_ = extraout_var;
    tmp.buffer._8_8_ = extraout_RDX;
    bVar4 = Compaction::ShouldStopBefore((Compaction *)in_RDX->_vptr_Iterator,(Slice *)&tmp);
    if ((bVar4) && (in_RDX[1].cleanup_.function != (CleanupFunction)0x0)) {
      FinishCompactionOutputFile((DBImpl *)local_118,compact,in_RDX);
      Status::operator=((Status *)this,(Status *)local_118);
      Status::~Status((Status *)local_118);
      if ((this->super_DB)._vptr_DB != (_func_int **)0x0) goto LAB_00108852;
    }
    if ((ulong)tmp.buffer._8_8_ < 8) {
LAB_00108638:
      current_user_key._M_string_length = 0;
      *current_user_key._M_dataplus._M_p = '\0';
      bVar19 = false;
      p_Var18 = (CleanupFunction)0xffffffffffffff;
LAB_0010865f:
      pTVar15 = (TableBuilder *)in_RDX[1].cleanup_.function;
      if (pTVar15 == (TableBuilder *)0x0) {
        OpenCompactionOutputFile((DBImpl *)local_118,compact);
        Status::operator=((Status *)this,(Status *)local_118);
        Status::~Status((Status *)local_118);
        if ((this->super_DB)._vptr_DB != (_func_int **)0x0) goto LAB_00108852;
        pTVar15 = (TableBuilder *)in_RDX[1].cleanup_.function;
      }
      uVar11 = TableBuilder::NumEntries(pTVar15);
      if (uVar11 == 0) {
        InternalKey::DecodeFrom
                  ((InternalKey *)((long)(in_RDX->cleanup_).arg2 + -0x40),(Slice *)&tmp);
      }
      InternalKey::DecodeFrom((InternalKey *)((long)(in_RDX->cleanup_).arg2 + -0x20),(Slice *)&tmp);
      pTVar15 = (TableBuilder *)in_RDX[1].cleanup_.function;
      iVar5 = (*pIVar8->_vptr_Iterator[9])(pIVar8);
      local_118._0_8_ = CONCAT44(extraout_var_00,iVar5);
      local_118._8_8_ = extraout_RDX_00;
      TableBuilder::Add(pTVar15,(Slice *)&tmp,(Slice *)local_118);
      p_Var12 = (_func_int *)TableBuilder::FileSize((TableBuilder *)in_RDX[1].cleanup_.function);
      if (in_RDX->_vptr_Iterator[1] <= p_Var12) {
        FinishCompactionOutputFile((DBImpl *)local_118,compact,in_RDX);
        Status::operator=((Status *)this,(Status *)local_118);
        Status::~Status((Status *)local_118);
        if ((this->super_DB)._vptr_DB != (_func_int **)0x0) goto LAB_00108852;
      }
    }
    else {
      uVar16 = *(ulong *)(tmp.buffer._0_8_ + -8 + tmp.buffer._8_8_);
      ikey.type = (ValueType)uVar16 & 0xff;
      ikey.sequence = uVar16 >> 8;
      ikey.user_key.size_ = tmp.buffer._8_8_ - 8;
      ikey.user_key.data_ = (char *)tmp.buffer._0_8_;
      if (kTypeValue < ikey.type) goto LAB_00108638;
      if (bVar19) {
        pOVar7 = (compact->outputs).
                 super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_118._0_8_ = current_user_key._M_dataplus._M_p;
        local_118._8_8_ = current_user_key._M_string_length;
        iVar5 = (**(code **)(pOVar7->number + 0x10))(pOVar7,&ikey,local_118);
        if (iVar5 != 0) goto LAB_001085f0;
      }
      else {
LAB_001085f0:
        std::__cxx11::string::assign((char *)&current_user_key,(ulong)ikey.user_key.data_);
        p_Var18 = (CleanupFunction)0xffffffffffffff;
      }
      p_Var2 = (in_RDX->cleanup_).function;
      if (p_Var2 < p_Var18) {
        if (p_Var2 < ikey.sequence || ikey.type != kTypeDeletion) {
          bVar19 = true;
          p_Var18 = (CleanupFunction)ikey.sequence;
        }
        else {
          bVar4 = Compaction::IsBaseLevelForKey((Compaction *)in_RDX->_vptr_Iterator,&ikey.user_key)
          ;
          bVar19 = true;
          p_Var18 = (CleanupFunction)ikey.sequence;
          if (bVar4) goto LAB_0010874e;
        }
        goto LAB_0010865f;
      }
      bVar19 = true;
      p_Var18 = (CleanupFunction)ikey.sequence;
    }
LAB_0010874e:
    (*pIVar8->_vptr_Iterator[6])(pIVar8);
  }
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    if (compact[3].outfile != (WritableFile *)0x0) {
      tmp.buffer._0_8_ = anon_var_dwarf_5925;
      tmp.buffer[8] = '\x1d';
      tmp.buffer[9] = '\0';
      tmp.buffer[10] = '\0';
      tmp.buffer[0xb] = '\0';
      tmp.buffer[0xc] = '\0';
      tmp.buffer[0xd] = '\0';
      tmp.buffer[0xe] = '\0';
      tmp.buffer[0xf] = '\0';
      local_118._0_8_ = "";
      local_118._8_8_ = (Env *)0x0;
      Status::IOError((Status *)(local_118 + 0x28),(Slice *)&tmp,(Slice *)local_118);
      Status::operator=((Status *)this,(Status *)(local_118 + 0x28));
      Status::~Status((Status *)(local_118 + 0x28));
    }
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      if (in_RDX[1].cleanup_.function != (CleanupFunction)0x0) {
        FinishCompactionOutputFile((DBImpl *)&tmp,compact,in_RDX);
        Status::operator=((Status *)this,(Status *)&tmp);
        Status::~Status((Status *)&tmp);
        if ((this->super_DB)._vptr_DB != (_func_int **)0x0) goto LAB_00108852;
      }
      (*pIVar8->_vptr_Iterator[10])(&tmp,pIVar8);
      Status::operator=((Status *)this,(Status *)&tmp);
      Status::~Status((Status *)&tmp);
    }
  }
LAB_00108852:
  (*pIVar8->_vptr_Iterator[1])(pIVar8);
  lVar9 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
  local_118._0_8_ = lVar9 - ((long)(_func_int ***)local_118._24_8_ + lVar6);
  local_118._8_8_ = (Env *)0x0;
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    p_Var12 = in_RDX->_vptr_Iterator[lVar6 * 3 + 0x18];
    uVar16 = (ulong)((long)in_RDX->_vptr_Iterator[lVar6 * 3 + 0x19] - (long)p_Var12) >> 3;
    uVar17 = uVar16 & 0xffffffff;
    if ((int)uVar16 < 1) {
      uVar17 = 0;
    }
    for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
      local_118._8_8_ =
           (long)&((Env *)local_118._8_8_)->_vptr_Env +
           *(long *)(*(long *)(p_Var12 + uVar16 * 8) + 0x10);
    }
  }
  pvVar3 = (in_RDX->cleanup_).arg1;
  lVar6 = ((long)(in_RDX->cleanup_).arg2 - (long)pvVar3) / 0x50;
  plVar14 = (long *)((long)pvVar3 + 8);
  local_118._16_8_ = (_func_int **)0x0;
  while (bVar19 = lVar6 != 0, lVar6 = lVar6 + -1, bVar19) {
    local_118._16_8_ = local_118._16_8_ + *plVar14;
    plVar14 = plVar14 + 10;
  }
  port::Mutex::Lock((Mutex *)local_118._32_8_);
  CompactionStats::Add
            ((CompactionStats *)
             (&compact[9].smallest_snapshot + (long)*(int *)in_RDX->_vptr_Iterator * 3),
             (CompactionStats *)local_118);
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    InstallCompactionResults((DBImpl *)&tmp,compact);
    Status::operator=((Status *)this,(Status *)&tmp);
    Status::~Status((Status *)&tmp);
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) goto LAB_0010895f;
  }
  RecordBackgroundError((DBImpl *)compact,(Status *)this);
LAB_0010895f:
  info_log = (Logger *)compact[1].smallest_snapshot;
  pcVar13 = VersionSet::LevelSummary
                      ((VersionSet *)
                       compact[8].outputs.
                       super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&tmp);
  Log(info_log,"compacted to: %s",pcVar13);
  std::__cxx11::string::~string((string *)&current_user_key);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::DoCompactionWork(CompactionState *compact) {
  const uint64_t start_micros = env_->NowMicros();
  int64_t imm_micros = 0;  // Micros spent doing imm_ compactions

  Log(options_.info_log, "Compacting %d@%d + %d@%d files",
      compact->compaction->num_input_files(0),
      compact->compaction->level(),
      compact->compaction->num_input_files(1),
      compact->compaction->level() + 1);

  assert(versions_->NumLevelFiles(compact->compaction->level()) > 0);
  assert(compact->builder==NULL);
  assert(compact->outfile==NULL);
  if (snapshots_.empty()) {
    compact->smallest_snapshot = versions_->LastSequence();
  } else {
    compact->smallest_snapshot = snapshots_.oldest()->number_;
  }

  // Release mutex while we're actually doing the compaction work
  mutex_.Unlock();

  Iterator *input = versions_->MakeInputIterator(compact->compaction);
  input->SeekToFirst();
  Status status;
  ParsedInternalKey ikey;
  std::string current_user_key;
  bool has_current_user_key = false;
  SequenceNumber last_sequence_for_key = kMaxSequenceNumber;
  for (; input->Valid() && !shutting_down_.Acquire_Load();) {
    // Prioritize immutable compaction work
    if (has_imm_.NoBarrier_Load()!=NULL) {
      const uint64_t imm_start = env_->NowMicros();
      mutex_.Lock();
      if (imm_!=NULL) {
        CompactMemTable();
        bg_cv_.SignalAll();  // Wakeup MakeRoomForWrite() if necessary
      }
      mutex_.Unlock();
      imm_micros += (env_->NowMicros() - imm_start);
    }

    Slice key = input->key();
    if (compact->compaction->ShouldStopBefore(key) &&
        compact->builder!=NULL) {//
      status = FinishCompactionOutputFile(compact, input);
      if (!status.ok()) {
        break;
      }
    }

    // Handle key/value, add to state, etc.
    bool drop = false;
    if (!ParseInternalKey(key, &ikey)) {
      // Do not hide error keys
      current_user_key.clear();
      has_current_user_key = false;
      last_sequence_for_key = kMaxSequenceNumber;
    } else {
      if (!has_current_user_key ||
          user_comparator()->Compare(ikey.user_key,
                                     Slice(current_user_key))!=0) {
        // First occurrence of this user key
        current_user_key.assign(ikey.user_key.data(), ikey.user_key.size());
        has_current_user_key = true;
        last_sequence_for_key = kMaxSequenceNumber;
      }

      if (last_sequence_for_key <= compact->smallest_snapshot) {
        // Hidden by an newer entry for same user key
        drop = true;    // (A)
      } else if (ikey.type==kTypeDeletion &&
          ikey.sequence <= compact->smallest_snapshot &&
          compact->compaction->IsBaseLevelForKey(ikey.user_key)) {
        // For this user key:
        // (1) there is no data in higher levels
        // (2) data in lower levels will have larger sequence numbers
        // (3) data in layers that are being compacted here and have
        //     smaller sequence numbers will be dropped in the next
        //     few iterations of this loop (by rule (A) above).
        // Therefore this deletion marker is obsolete and can be dropped.
        drop = true;
      }

      last_sequence_for_key = ikey.sequence;
    }
#if 0
    Log(options_.info_log,
        "  Compact: %s, seq %d, type: %d %d, drop: %d, is_base: %d, "
        "%d smallest_snapshot: %d",
        ikey.user_key.ToString().c_str(),
        (int)ikey.sequence, ikey.type, kTypeValue, drop,
        compact->compaction->IsBaseLevelForKey(ikey.user_key),
        (int)last_sequence_for_key, (int)compact->smallest_snapshot);
#endif

    if (!drop) {
      // Open output file if necessary
      if (compact->builder==NULL) {
        status = OpenCompactionOutputFile(compact);
        if (!status.ok()) {
          break;
        }
      }
      if (compact->builder->NumEntries()==0) {
        compact->current_output()->smallest.DecodeFrom(key);
      }
      compact->current_output()->largest.DecodeFrom(key);
      compact->builder->Add(key, input->value());

      // Close output file if it is big enough
      if (compact->builder->FileSize() >=
          compact->compaction->MaxOutputFileSize()) {
        status = FinishCompactionOutputFile(compact, input);
        if (!status.ok()) {
          break;
        }
      }
    }

    input->Next();
  }

  if (status.ok() && shutting_down_.Acquire_Load()) {
    status = Status::IOError("Deleting DB during compaction");
  }
  if (status.ok() && compact->builder!=NULL) {
    status = FinishCompactionOutputFile(compact, input);
  }
  if (status.ok()) {
    status = input->status();
  }
  delete input;
  input = NULL;

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros - imm_micros;
  for (int which = 0; which < 2; which++) {
    for (int i = 0; i < compact->compaction->num_input_files(which); i++) {
      stats.bytes_read += compact->compaction->input(which, i)->file_size;
    }
  }
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    stats.bytes_written += compact->outputs[i].file_size;
  }

  mutex_.Lock();
  stats_[compact->compaction->level() + 1].Add(stats);

  if (status.ok()) {
    status = InstallCompactionResults(compact);
  }
  if (!status.ok()) {
    RecordBackgroundError(status);
  }
  VersionSet::LevelSummaryStorage tmp;
  Log(options_.info_log,
      "compacted to: %s", versions_->LevelSummary(&tmp));
  return status;
}